

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iadst16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar11;
  int iVar16;
  undefined1 auVar9 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar10 [16];
  int iVar27;
  uint uVar28;
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar44;
  uint uVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar45;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  undefined1 auVar43 [16];
  uint uVar50;
  int iVar55;
  int iVar57;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar59;
  undefined1 auVar53 [16];
  uint uVar56;
  uint uVar58;
  uint uVar60;
  undefined1 auVar54 [16];
  int iVar61;
  int iVar62;
  uint uVar63;
  uint uVar64;
  int iVar70;
  int iVar74;
  __m128i offset;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar71;
  int iVar75;
  int iVar78;
  int iVar79;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar72;
  uint uVar73;
  uint uVar76;
  uint uVar77;
  uint uVar80;
  uint uVar81;
  undefined1 auVar69 [16];
  int iVar82;
  uint uVar83;
  int iVar87;
  int iVar89;
  undefined1 auVar84 [16];
  int iVar91;
  undefined1 auVar85 [16];
  uint uVar88;
  uint uVar90;
  uint uVar92;
  undefined1 auVar86 [16];
  int iVar93;
  uint uVar94;
  uint uVar95;
  int iVar101;
  uint uVar103;
  int iVar104;
  uint uVar106;
  undefined1 auVar96 [16];
  int iVar107;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  uint uVar102;
  uint uVar105;
  uint uVar108;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar109;
  int iVar110;
  uint uVar111;
  int iVar115;
  uint uVar116;
  int iVar117;
  uint uVar118;
  undefined1 auVar112 [16];
  int iVar119;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  uint uVar120;
  int iVar121;
  uint uVar122;
  int iVar125;
  uint uVar126;
  int iVar127;
  uint uVar128;
  undefined1 auVar123 [16];
  int iVar129;
  undefined1 auVar124 [16];
  uint uVar130;
  int iVar131;
  int iVar133;
  int iVar134;
  undefined1 auVar132 [16];
  int iVar135;
  int iVar136;
  uint uVar137;
  int iVar141;
  int iVar143;
  undefined1 auVar138 [16];
  int iVar145;
  undefined1 auVar139 [16];
  uint uVar142;
  uint uVar144;
  uint uVar146;
  undefined1 auVar140 [16];
  int iVar147;
  int iVar149;
  int iVar150;
  undefined1 auVar148 [16];
  int iVar151;
  int iVar152;
  uint uVar153;
  int iVar157;
  int iVar159;
  int iVar161;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar158;
  uint uVar160;
  uint uVar162;
  undefined1 auVar156 [16];
  int iVar163;
  uint uVar164;
  uint uVar165;
  int iVar170;
  uint uVar172;
  int iVar173;
  uint uVar175;
  undefined1 auVar166 [16];
  uint uVar171;
  uint uVar174;
  int iVar176;
  uint uVar177;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  uint uVar178;
  uint uVar179;
  uint uVar183;
  uint uVar184;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  uint uVar185;
  undefined1 auVar182 [16];
  uint uVar186;
  int iVar191;
  int iVar193;
  undefined1 auVar187 [16];
  int iVar195;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  uint uVar192;
  uint uVar194;
  uint uVar196;
  undefined1 auVar190 [16];
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  
  lVar2 = (long)bit * 0x100;
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x168);
  auVar84._4_4_ = uVar1;
  auVar84._0_4_ = uVar1;
  auVar84._8_4_ = uVar1;
  auVar84._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 600);
  auVar96._4_4_ = uVar1;
  auVar96._0_4_ = uVar1;
  auVar96._8_4_ = uVar1;
  auVar96._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x188);
  auVar66._4_4_ = uVar1;
  auVar66._0_4_ = uVar1;
  auVar66._8_4_ = uVar1;
  auVar66._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x238);
  auVar138._4_4_ = uVar1;
  auVar138._0_4_ = uVar1;
  auVar138._8_4_ = uVar1;
  auVar138._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1a8);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x218);
  auVar123._4_4_ = uVar1;
  auVar123._0_4_ = uVar1;
  auVar123._8_4_ = uVar1;
  auVar123._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1c8);
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1f8);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1e8);
  auVar148._4_4_ = uVar1;
  auVar148._0_4_ = uVar1;
  auVar148._8_4_ = uVar1;
  auVar148._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1d8);
  auVar112._4_4_ = uVar1;
  auVar112._0_4_ = uVar1;
  auVar112._8_4_ = uVar1;
  auVar112._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x208);
  auVar132._4_4_ = uVar1;
  auVar132._0_4_ = uVar1;
  auVar132._8_4_ = uVar1;
  auVar132._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1b8);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x228);
  auVar187._4_4_ = uVar1;
  auVar187._0_4_ = uVar1;
  auVar187._8_4_ = uVar1;
  auVar187._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x198);
  auVar166 = pmulld(auVar96,(undefined1  [16])*in);
  auVar96 = pmulld(auVar84,(undefined1  [16])*in);
  auVar138 = pmulld(auVar138,(undefined1  [16])in[2]);
  auVar84 = pmulld(auVar66,(undefined1  [16])in[2]);
  auVar123 = pmulld(auVar123,(undefined1  [16])in[4]);
  auVar65 = pmulld(auVar65,(undefined1  [16])in[4]);
  auVar39 = pmulld(auVar39,(undefined1  [16])in[6]);
  auVar9 = pmulld(auVar9,(undefined1  [16])in[6]);
  auVar148 = pmulld(auVar148,(undefined1  [16])in[7]);
  auVar112 = pmulld(auVar112,(undefined1  [16])in[7]);
  auVar132 = pmulld(auVar132,(undefined1  [16])in[5]);
  auVar51 = pmulld(auVar51,(undefined1  [16])in[5]);
  auVar187 = pmulld(auVar187,(undefined1  [16])in[3]);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar66 = pmulld(auVar40,(undefined1  [16])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x248);
  auVar188._4_4_ = uVar1;
  auVar188._0_4_ = uVar1;
  auVar188._8_4_ = uVar1;
  auVar188._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x178);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar40 = ZEXT416((uint)bit);
  iVar163 = auVar166._0_4_ + iVar3 >> auVar40;
  iVar170 = auVar166._4_4_ + iVar3 >> auVar40;
  iVar173 = auVar166._8_4_ + iVar3 >> auVar40;
  iVar176 = auVar166._12_4_ + iVar3 >> auVar40;
  auVar166 = pmulld(auVar188,(undefined1  [16])in[1]);
  auVar52 = pmulld(auVar52,(undefined1  [16])in[1]);
  iVar27 = iVar3 - auVar96._0_4_ >> auVar40;
  iVar31 = iVar3 - auVar96._4_4_ >> auVar40;
  iVar33 = iVar3 - auVar96._8_4_ >> auVar40;
  iVar35 = iVar3 - auVar96._12_4_ >> auVar40;
  iVar147 = auVar148._0_4_ + iVar3 >> auVar40;
  iVar149 = auVar148._4_4_ + iVar3 >> auVar40;
  iVar150 = auVar148._8_4_ + iVar3 >> auVar40;
  iVar151 = auVar148._12_4_ + iVar3 >> auVar40;
  iVar4 = iVar147 + iVar163;
  iVar11 = iVar149 + iVar170;
  iVar16 = iVar150 + iVar173;
  iVar21 = iVar151 + iVar176;
  iVar163 = iVar163 - iVar147;
  iVar170 = iVar170 - iVar149;
  iVar173 = iVar173 - iVar150;
  iVar176 = iVar176 - iVar151;
  iVar147 = auVar112._0_4_ + iVar3 >> auVar40;
  iVar149 = auVar112._4_4_ + iVar3 >> auVar40;
  iVar150 = auVar112._8_4_ + iVar3 >> auVar40;
  iVar151 = auVar112._12_4_ + iVar3 >> auVar40;
  iVar5 = iVar147 + iVar27;
  iVar12 = iVar149 + iVar31;
  iVar17 = iVar150 + iVar33;
  iVar22 = iVar151 + iVar35;
  iVar27 = iVar27 - iVar147;
  iVar31 = iVar31 - iVar149;
  iVar33 = iVar33 - iVar150;
  iVar35 = iVar35 - iVar151;
  iVar136 = auVar138._0_4_ + iVar3 >> auVar40;
  iVar141 = auVar138._4_4_ + iVar3 >> auVar40;
  iVar143 = auVar138._8_4_ + iVar3 >> auVar40;
  iVar145 = auVar138._12_4_ + iVar3 >> auVar40;
  iVar93 = iVar3 - auVar84._0_4_ >> auVar40;
  iVar101 = iVar3 - auVar84._4_4_ >> auVar40;
  iVar104 = iVar3 - auVar84._8_4_ >> auVar40;
  iVar107 = iVar3 - auVar84._12_4_ >> auVar40;
  iVar131 = auVar132._0_4_ + iVar3 >> auVar40;
  iVar133 = auVar132._4_4_ + iVar3 >> auVar40;
  iVar134 = auVar132._8_4_ + iVar3 >> auVar40;
  iVar135 = auVar132._12_4_ + iVar3 >> auVar40;
  local_e8 = auVar51._0_4_;
  iStack_e4 = auVar51._4_4_;
  iStack_e0 = auVar51._8_4_;
  iStack_dc = auVar51._12_4_;
  iVar147 = local_e8 + iVar3 >> auVar40;
  iVar149 = iStack_e4 + iVar3 >> auVar40;
  iVar150 = iStack_e0 + iVar3 >> auVar40;
  iVar151 = iStack_dc + iVar3 >> auVar40;
  iVar6 = iVar131 + iVar136;
  iVar13 = iVar133 + iVar141;
  iVar18 = iVar134 + iVar143;
  iVar23 = iVar135 + iVar145;
  iVar136 = iVar136 - iVar131;
  iVar141 = iVar141 - iVar133;
  iVar143 = iVar143 - iVar134;
  iVar145 = iVar145 - iVar135;
  iVar7 = iVar147 + iVar93;
  iVar14 = iVar149 + iVar101;
  iVar19 = iVar150 + iVar104;
  iVar24 = iVar151 + iVar107;
  iVar93 = iVar93 - iVar147;
  iVar101 = iVar101 - iVar149;
  iVar104 = iVar104 - iVar150;
  iVar107 = iVar107 - iVar151;
  iVar121 = auVar123._0_4_ + iVar3 >> auVar40;
  iVar125 = auVar123._4_4_ + iVar3 >> auVar40;
  iVar127 = auVar123._8_4_ + iVar3 >> auVar40;
  iVar129 = auVar123._12_4_ + iVar3 >> auVar40;
  local_f8 = auVar187._0_4_;
  iStack_f4 = auVar187._4_4_;
  iStack_f0 = auVar187._8_4_;
  iStack_ec = auVar187._12_4_;
  iVar147 = local_f8 + iVar3 >> auVar40;
  iVar149 = iStack_f4 + iVar3 >> auVar40;
  iVar150 = iStack_f0 + iVar3 >> auVar40;
  iVar151 = iStack_ec + iVar3 >> auVar40;
  iVar110 = iVar147 + iVar121;
  iVar115 = iVar149 + iVar125;
  iVar117 = iVar150 + iVar127;
  iVar119 = iVar151 + iVar129;
  iVar121 = iVar121 - iVar147;
  iVar125 = iVar125 - iVar149;
  iVar127 = iVar127 - iVar150;
  iVar129 = iVar129 - iVar151;
  iVar82 = iVar3 - auVar65._0_4_ >> auVar40;
  iVar87 = iVar3 - auVar65._4_4_ >> auVar40;
  iVar89 = iVar3 - auVar65._8_4_ >> auVar40;
  iVar91 = iVar3 - auVar65._12_4_ >> auVar40;
  iVar147 = auVar66._0_4_ + iVar3 >> auVar40;
  iVar149 = auVar66._4_4_ + iVar3 >> auVar40;
  iVar150 = auVar66._8_4_ + iVar3 >> auVar40;
  iVar151 = auVar66._12_4_ + iVar3 >> auVar40;
  iVar61 = iVar147 + iVar82;
  iVar70 = iVar149 + iVar87;
  iVar74 = iVar150 + iVar89;
  iVar78 = iVar151 + iVar91;
  iVar82 = iVar82 - iVar147;
  iVar87 = iVar87 - iVar149;
  iVar89 = iVar89 - iVar150;
  iVar91 = iVar91 - iVar151;
  iVar147 = *(int *)((long)vert_filter_length_chroma + lVar2 + 0x240);
  iVar133 = -iVar147;
  iVar149 = *(int *)((long)vert_filter_length_chroma + lVar2 + 0x1c0);
  iVar150 = *(int *)((long)vert_filter_length_chroma + lVar2 + 0x220);
  iVar131 = -iVar149;
  iVar134 = -iVar150;
  iVar135 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar151 = 0x8000;
  if (0xf < iVar135) {
    iVar151 = 1 << ((char)iVar135 - 1U & 0x1f);
  }
  local_b8 = auVar39._0_4_;
  iStack_b4 = auVar39._4_4_;
  iStack_b0 = auVar39._8_4_;
  iStack_ac = auVar39._12_4_;
  iVar62 = local_b8 + iVar3 >> auVar40;
  iVar71 = iStack_b4 + iVar3 >> auVar40;
  iVar75 = iStack_b0 + iVar3 >> auVar40;
  iVar79 = iStack_ac + iVar3 >> auVar40;
  iVar135 = auVar166._0_4_ + iVar3 >> auVar40;
  iVar191 = auVar166._4_4_ + iVar3 >> auVar40;
  iVar193 = auVar166._8_4_ + iVar3 >> auVar40;
  iVar195 = auVar166._12_4_ + iVar3 >> auVar40;
  iVar8 = iVar135 + iVar62;
  iVar15 = iVar191 + iVar71;
  iVar20 = iVar193 + iVar75;
  iVar25 = iVar195 + iVar79;
  iVar62 = iVar62 - iVar135;
  iVar71 = iVar71 - iVar191;
  iVar75 = iVar75 - iVar193;
  iVar79 = iVar79 - iVar195;
  iVar152 = iVar3 - auVar9._0_4_ >> auVar40;
  iVar157 = iVar3 - auVar9._4_4_ >> auVar40;
  iVar159 = iVar3 - auVar9._8_4_ >> auVar40;
  iVar161 = iVar3 - auVar9._12_4_ >> auVar40;
  iVar135 = auVar52._0_4_ + iVar3 >> auVar40;
  iVar55 = auVar52._4_4_ + iVar3 >> auVar40;
  iVar57 = auVar52._8_4_ + iVar3 >> auVar40;
  iVar59 = auVar52._12_4_ + iVar3 >> auVar40;
  iVar191 = iVar135 + iVar152;
  iVar193 = iVar55 + iVar157;
  iVar195 = iVar57 + iVar159;
  iVar26 = iVar59 + iVar161;
  iVar152 = iVar152 - iVar135;
  iVar157 = iVar157 - iVar55;
  iVar159 = iVar159 - iVar57;
  iVar161 = iVar161 - iVar59;
  iVar135 = -iVar151;
  iVar151 = iVar151 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x180);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar113._4_4_ = iVar147;
  auVar113._0_4_ = iVar147;
  auVar113._8_4_ = iVar147;
  auVar113._12_4_ = iVar147;
  uVar164 = (uint)(iVar163 < iVar135) * iVar135 | (uint)(iVar163 >= iVar135) * iVar163;
  uVar171 = (uint)(iVar170 < iVar135) * iVar135 | (uint)(iVar170 >= iVar135) * iVar170;
  uVar174 = (uint)(iVar173 < iVar135) * iVar135 | (uint)(iVar173 >= iVar135) * iVar173;
  uVar177 = (uint)(iVar176 < iVar135) * iVar135 | (uint)(iVar176 >= iVar135) * iVar176;
  auVar167._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar167._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar167._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar167._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar27 < iVar135) * iVar135 | (uint)(iVar27 >= iVar135) * iVar27;
  uVar171 = (uint)(iVar31 < iVar135) * iVar135 | (uint)(iVar31 >= iVar135) * iVar31;
  uVar174 = (uint)(iVar33 < iVar135) * iVar135 | (uint)(iVar33 >= iVar135) * iVar33;
  uVar177 = (uint)(iVar35 < iVar135) * iVar135 | (uint)(iVar35 >= iVar135) * iVar35;
  auVar29._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar29._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar29._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar29._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar9 = pmulld(auVar167,auVar113);
  auVar84 = pmulld(auVar113,auVar29);
  auVar138 = pmulld(auVar167,auVar53);
  auVar39 = pmulld(auVar29,auVar53);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x200);
  auVar114._4_4_ = uVar1;
  auVar114._0_4_ = uVar1;
  auVar114._8_4_ = uVar1;
  auVar114._12_4_ = uVar1;
  auVar168._4_4_ = iVar149;
  auVar168._0_4_ = iVar149;
  auVar168._8_4_ = iVar149;
  auVar168._12_4_ = iVar149;
  uVar164 = (uint)(iVar136 < iVar135) * iVar135 | (uint)(iVar136 >= iVar135) * iVar136;
  uVar171 = (uint)(iVar141 < iVar135) * iVar135 | (uint)(iVar141 >= iVar135) * iVar141;
  uVar174 = (uint)(iVar143 < iVar135) * iVar135 | (uint)(iVar143 >= iVar135) * iVar143;
  uVar177 = (uint)(iVar145 < iVar135) * iVar135 | (uint)(iVar145 >= iVar135) * iVar145;
  auVar139._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar139._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar139._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar139._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar93 < iVar135) * iVar135 | (uint)(iVar93 >= iVar135) * iVar93;
  uVar171 = (uint)(iVar101 < iVar135) * iVar135 | (uint)(iVar101 >= iVar135) * iVar101;
  uVar174 = (uint)(iVar104 < iVar135) * iVar135 | (uint)(iVar104 >= iVar135) * iVar104;
  uVar177 = (uint)(iVar107 < iVar135) * iVar135 | (uint)(iVar107 >= iVar135) * iVar107;
  auVar97._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar97._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar97._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar97._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar187 = pmulld(auVar114,auVar97);
  auVar66 = pmulld(auVar97,auVar168);
  auVar148 = pmulld(auVar168,auVar139);
  auVar123 = pmulld(auVar139,auVar114);
  auVar180._4_4_ = iVar133;
  auVar180._0_4_ = iVar133;
  auVar180._8_4_ = iVar133;
  auVar180._12_4_ = iVar133;
  uVar164 = (uint)(iVar121 < iVar135) * iVar135 | (uint)(iVar121 >= iVar135) * iVar121;
  uVar171 = (uint)(iVar125 < iVar135) * iVar135 | (uint)(iVar125 >= iVar135) * iVar125;
  uVar174 = (uint)(iVar127 < iVar135) * iVar135 | (uint)(iVar127 >= iVar135) * iVar127;
  uVar177 = (uint)(iVar129 < iVar135) * iVar135 | (uint)(iVar129 >= iVar135) * iVar129;
  auVar124._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar124._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar124._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar124._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar82 < iVar135) * iVar135 | (uint)(iVar82 >= iVar135) * iVar82;
  uVar171 = (uint)(iVar87 < iVar135) * iVar135 | (uint)(iVar87 >= iVar135) * iVar87;
  uVar174 = (uint)(iVar89 < iVar135) * iVar135 | (uint)(iVar89 >= iVar135) * iVar89;
  uVar177 = (uint)(iVar91 < iVar135) * iVar135 | (uint)(iVar91 >= iVar135) * iVar91;
  auVar85._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar85._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar85._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar85._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar188 = pmulld(auVar85,auVar53);
  auVar51 = pmulld(auVar53,auVar124);
  auVar112 = pmulld(auVar124,auVar180);
  auVar65 = pmulld(auVar85,auVar180);
  auVar98._4_4_ = iVar131;
  auVar98._0_4_ = iVar131;
  auVar98._8_4_ = iVar131;
  auVar98._12_4_ = iVar131;
  uVar164 = (uint)(iVar62 < iVar135) * iVar135 | (uint)(iVar62 >= iVar135) * iVar62;
  uVar171 = (uint)(iVar71 < iVar135) * iVar135 | (uint)(iVar71 >= iVar135) * iVar71;
  uVar174 = (uint)(iVar75 < iVar135) * iVar135 | (uint)(iVar75 >= iVar135) * iVar75;
  uVar177 = (uint)(iVar79 < iVar135) * iVar135 | (uint)(iVar79 >= iVar135) * iVar79;
  auVar67._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar67._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar67._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar67._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar152 < iVar135) * iVar135 | (uint)(iVar152 >= iVar135) * iVar152;
  uVar171 = (uint)(iVar157 < iVar135) * iVar135 | (uint)(iVar157 >= iVar135) * iVar157;
  uVar174 = (uint)(iVar159 < iVar135) * iVar135 | (uint)(iVar159 >= iVar135) * iVar159;
  uVar177 = (uint)(iVar161 < iVar135) * iVar135 | (uint)(iVar161 >= iVar135) * iVar161;
  auVar154._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar154._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar154._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar154._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar166 = pmulld(auVar154,auVar114);
  auVar96 = pmulld(auVar114,auVar67);
  auVar52 = pmulld(auVar67,auVar98);
  auVar132 = pmulld(auVar154,auVar98);
  uVar164 = (uint)(iVar4 < iVar135) * iVar135 | (uint)(iVar4 >= iVar135) * iVar4;
  uVar171 = (uint)(iVar11 < iVar135) * iVar135 | (uint)(iVar11 >= iVar135) * iVar11;
  uVar174 = (uint)(iVar16 < iVar135) * iVar135 | (uint)(iVar16 >= iVar135) * iVar16;
  uVar177 = (uint)(iVar21 < iVar135) * iVar135 | (uint)(iVar21 >= iVar135) * iVar21;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar94 = (uint)(iVar110 < iVar135) * iVar135 | (uint)(iVar110 >= iVar135) * iVar110;
  uVar102 = (uint)(iVar115 < iVar135) * iVar135 | (uint)(iVar115 >= iVar135) * iVar115;
  uVar105 = (uint)(iVar117 < iVar135) * iVar135 | (uint)(iVar117 >= iVar135) * iVar117;
  uVar108 = (uint)(iVar119 < iVar135) * iVar135 | (uint)(iVar119 >= iVar135) * iVar119;
  uVar94 = (uint)(iVar151 < (int)uVar94) * iVar151 | (iVar151 >= (int)uVar94) * uVar94;
  uVar102 = (uint)(iVar151 < (int)uVar102) * iVar151 | (iVar151 >= (int)uVar102) * uVar102;
  uVar105 = (uint)(iVar151 < (int)uVar105) * iVar151 | (iVar151 >= (int)uVar105) * uVar105;
  uVar108 = (uint)(iVar151 < (int)uVar108) * iVar151 | (iVar151 >= (int)uVar108) * uVar108;
  iVar4 = uVar94 + uVar164;
  iVar21 = uVar102 + uVar171;
  iVar27 = uVar105 + uVar174;
  iVar82 = uVar108 + uVar177;
  iVar104 = uVar164 - uVar94;
  iVar110 = uVar171 - uVar102;
  iVar117 = uVar174 - uVar105;
  iVar121 = uVar177 - uVar108;
  uVar164 = (uint)(iVar5 < iVar135) * iVar135 | (uint)(iVar5 >= iVar135) * iVar5;
  uVar171 = (uint)(iVar12 < iVar135) * iVar135 | (uint)(iVar12 >= iVar135) * iVar12;
  uVar174 = (uint)(iVar17 < iVar135) * iVar135 | (uint)(iVar17 >= iVar135) * iVar17;
  uVar177 = (uint)(iVar22 < iVar135) * iVar135 | (uint)(iVar22 >= iVar135) * iVar22;
  uVar94 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar102 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar105 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar108 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar61 < iVar135) * iVar135 | (uint)(iVar61 >= iVar135) * iVar61;
  uVar171 = (uint)(iVar70 < iVar135) * iVar135 | (uint)(iVar70 >= iVar135) * iVar70;
  uVar174 = (uint)(iVar74 < iVar135) * iVar135 | (uint)(iVar74 >= iVar135) * iVar74;
  uVar177 = (uint)(iVar78 < iVar135) * iVar135 | (uint)(iVar78 >= iVar135) * iVar78;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  iVar5 = uVar164 + uVar94;
  iVar22 = uVar171 + uVar102;
  iVar31 = uVar174 + uVar105;
  iVar78 = uVar177 + uVar108;
  iVar55 = uVar94 - uVar164;
  iVar57 = uVar102 - uVar171;
  iVar59 = uVar105 - uVar174;
  iVar62 = uVar108 - uVar177;
  uVar164 = (uint)(iVar6 < iVar135) * iVar135 | (uint)(iVar6 >= iVar135) * iVar6;
  uVar171 = (uint)(iVar13 < iVar135) * iVar135 | (uint)(iVar13 >= iVar135) * iVar13;
  uVar174 = (uint)(iVar18 < iVar135) * iVar135 | (uint)(iVar18 >= iVar135) * iVar18;
  uVar177 = (uint)(iVar23 < iVar135) * iVar135 | (uint)(iVar23 >= iVar135) * iVar23;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar94 = (uint)(iVar8 < iVar135) * iVar135 | (uint)(iVar8 >= iVar135) * iVar8;
  uVar102 = (uint)(iVar15 < iVar135) * iVar135 | (uint)(iVar15 >= iVar135) * iVar15;
  uVar105 = (uint)(iVar20 < iVar135) * iVar135 | (uint)(iVar20 >= iVar135) * iVar20;
  uVar108 = (uint)(iVar25 < iVar135) * iVar135 | (uint)(iVar25 >= iVar135) * iVar25;
  uVar94 = (uint)(iVar151 < (int)uVar94) * iVar151 | (iVar151 >= (int)uVar94) * uVar94;
  uVar102 = (uint)(iVar151 < (int)uVar102) * iVar151 | (iVar151 >= (int)uVar102) * uVar102;
  uVar105 = (uint)(iVar151 < (int)uVar105) * iVar151 | (iVar151 >= (int)uVar105) * uVar105;
  uVar108 = (uint)(iVar151 < (int)uVar108) * iVar151 | (iVar151 >= (int)uVar108) * uVar108;
  iVar6 = uVar94 + uVar164;
  iVar13 = uVar102 + uVar171;
  iVar33 = uVar105 + uVar174;
  iVar87 = uVar108 + uVar177;
  iVar107 = uVar164 - uVar94;
  iVar115 = uVar171 - uVar102;
  iVar119 = uVar174 - uVar105;
  iVar125 = uVar177 - uVar108;
  uVar164 = (uint)(iVar7 < iVar135) * iVar135 | (uint)(iVar7 >= iVar135) * iVar7;
  uVar171 = (uint)(iVar14 < iVar135) * iVar135 | (uint)(iVar14 >= iVar135) * iVar14;
  uVar174 = (uint)(iVar19 < iVar135) * iVar135 | (uint)(iVar19 >= iVar135) * iVar19;
  uVar177 = (uint)(iVar24 < iVar135) * iVar135 | (uint)(iVar24 >= iVar135) * iVar24;
  uVar94 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar102 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar105 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar108 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar191 < iVar135) * iVar135 | (uint)(iVar191 >= iVar135) * iVar191;
  uVar171 = (uint)(iVar193 < iVar135) * iVar135 | (uint)(iVar193 >= iVar135) * iVar193;
  uVar174 = (uint)(iVar195 < iVar135) * iVar135 | (uint)(iVar195 >= iVar135) * iVar195;
  uVar177 = (uint)(iVar26 < iVar135) * iVar135 | (uint)(iVar26 >= iVar135) * iVar26;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  iVar25 = uVar164 + uVar94;
  iVar71 = uVar171 + uVar102;
  iVar79 = uVar174 + uVar105;
  iVar157 = uVar177 + uVar108;
  iVar127 = uVar94 - uVar164;
  iVar136 = uVar102 - uVar171;
  iVar143 = uVar105 - uVar174;
  iVar163 = uVar108 - uVar177;
  iVar129 = auVar138._0_4_ + iVar3 + auVar84._0_4_ >> auVar40;
  iVar141 = auVar138._4_4_ + iVar3 + auVar84._4_4_ >> auVar40;
  iVar145 = auVar138._8_4_ + iVar3 + auVar84._8_4_ >> auVar40;
  iVar170 = auVar138._12_4_ + iVar3 + auVar84._12_4_ >> auVar40;
  iVar147 = (auVar9._0_4_ + iVar3) - auVar39._0_4_ >> auVar40;
  iVar149 = (auVar9._4_4_ + iVar3) - auVar39._4_4_ >> auVar40;
  iVar131 = (auVar9._8_4_ + iVar3) - auVar39._8_4_ >> auVar40;
  iVar133 = (auVar9._12_4_ + iVar3) - auVar39._12_4_ >> auVar40;
  iVar7 = auVar112._0_4_ + iVar3 + auVar188._0_4_ >> auVar40;
  iVar12 = auVar112._4_4_ + iVar3 + auVar188._4_4_ >> auVar40;
  iVar14 = auVar112._8_4_ + iVar3 + auVar188._8_4_ >> auVar40;
  iVar16 = auVar112._12_4_ + iVar3 + auVar188._12_4_ >> auVar40;
  iVar11 = iVar7 + iVar129;
  iVar18 = iVar12 + iVar141;
  iVar35 = iVar14 + iVar145;
  iVar89 = iVar16 + iVar170;
  iVar129 = iVar129 - iVar7;
  iVar141 = iVar141 - iVar12;
  iVar145 = iVar145 - iVar14;
  iVar170 = iVar170 - iVar16;
  iVar7 = (auVar51._0_4_ + iVar3) - auVar65._0_4_ >> auVar40;
  iVar14 = (auVar51._4_4_ + iVar3) - auVar65._4_4_ >> auVar40;
  iVar16 = (auVar51._8_4_ + iVar3) - auVar65._8_4_ >> auVar40;
  iVar17 = (auVar51._12_4_ + iVar3) - auVar65._12_4_ >> auVar40;
  iVar12 = iVar7 + iVar147;
  iVar19 = iVar14 + iVar149;
  iVar61 = iVar16 + iVar131;
  iVar91 = iVar17 + iVar133;
  iVar147 = iVar147 - iVar7;
  iVar149 = iVar149 - iVar14;
  iVar131 = iVar131 - iVar16;
  iVar133 = iVar133 - iVar17;
  iVar26 = auVar123._0_4_ + iVar3 + auVar66._0_4_ >> auVar40;
  iVar75 = auVar123._4_4_ + iVar3 + auVar66._4_4_ >> auVar40;
  iVar152 = auVar123._8_4_ + iVar3 + auVar66._8_4_ >> auVar40;
  iVar159 = auVar123._12_4_ + iVar3 + auVar66._12_4_ >> auVar40;
  iVar15 = (auVar148._0_4_ + iVar3) - auVar187._0_4_ >> auVar40;
  iVar193 = (auVar148._4_4_ + iVar3) - auVar187._4_4_ >> auVar40;
  iVar20 = (auVar148._8_4_ + iVar3) - auVar187._8_4_ >> auVar40;
  iVar195 = (auVar148._12_4_ + iVar3) - auVar187._12_4_ >> auVar40;
  iVar7 = auVar52._0_4_ + iVar3 + auVar166._0_4_ >> auVar40;
  iVar14 = auVar52._4_4_ + iVar3 + auVar166._4_4_ >> auVar40;
  iVar17 = auVar52._8_4_ + iVar3 + auVar166._8_4_ >> auVar40;
  iVar24 = auVar52._12_4_ + iVar3 + auVar166._12_4_ >> auVar40;
  iVar173 = (auVar96._0_4_ + iVar3) - auVar132._0_4_ >> auVar40;
  iVar176 = (auVar96._4_4_ + iVar3) - auVar132._4_4_ >> auVar40;
  iVar8 = (auVar96._8_4_ + iVar3) - auVar132._8_4_ >> auVar40;
  iVar191 = (auVar96._12_4_ + iVar3) - auVar132._12_4_ >> auVar40;
  iVar16 = iVar7 + iVar26;
  iVar23 = iVar14 + iVar75;
  iVar70 = iVar17 + iVar152;
  iVar93 = iVar24 + iVar159;
  iVar26 = iVar26 - iVar7;
  iVar75 = iVar75 - iVar14;
  iVar152 = iVar152 - iVar17;
  iVar159 = iVar159 - iVar24;
  iVar17 = iVar173 + iVar15;
  iVar24 = iVar176 + iVar193;
  iVar74 = iVar8 + iVar20;
  iVar101 = iVar191 + iVar195;
  iVar15 = iVar15 - iVar173;
  iVar193 = iVar193 - iVar176;
  iVar20 = iVar20 - iVar8;
  iVar195 = iVar195 - iVar191;
  auVar181._4_4_ = iVar150;
  auVar181._0_4_ = iVar150;
  auVar181._8_4_ = iVar150;
  auVar181._12_4_ = iVar150;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1a0);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  uVar164 = (uint)(iVar104 < iVar135) * iVar135 | (uint)(iVar104 >= iVar135) * iVar104;
  uVar171 = (uint)(iVar110 < iVar135) * iVar135 | (uint)(iVar110 >= iVar135) * iVar110;
  uVar174 = (uint)(iVar117 < iVar135) * iVar135 | (uint)(iVar117 >= iVar135) * iVar117;
  uVar177 = (uint)(iVar121 < iVar135) * iVar135 | (uint)(iVar121 >= iVar135) * iVar121;
  auVar41._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar41._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar41._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar41._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar55 < iVar135) * iVar135 | (uint)(iVar55 >= iVar135) * iVar55;
  uVar171 = (uint)(iVar57 < iVar135) * iVar135 | (uint)(iVar57 >= iVar135) * iVar57;
  uVar174 = (uint)(iVar59 < iVar135) * iVar135 | (uint)(iVar59 >= iVar135) * iVar59;
  uVar177 = (uint)(iVar62 < iVar135) * iVar135 | (uint)(iVar62 >= iVar135) * iVar62;
  auVar99._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar99._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar99._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar99._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar84 = pmulld(auVar30,auVar99);
  auVar123 = pmulld(auVar99,auVar181);
  auVar52 = pmulld(auVar41,auVar30);
  auVar138 = pmulld(auVar41,auVar181);
  auVar100._4_4_ = iVar134;
  auVar100._0_4_ = iVar134;
  auVar100._8_4_ = iVar134;
  auVar100._12_4_ = iVar134;
  uVar164 = (uint)(iVar107 < iVar135) * iVar135 | (uint)(iVar107 >= iVar135) * iVar107;
  uVar171 = (uint)(iVar115 < iVar135) * iVar135 | (uint)(iVar115 >= iVar135) * iVar115;
  uVar174 = (uint)(iVar119 < iVar135) * iVar135 | (uint)(iVar119 >= iVar135) * iVar119;
  uVar177 = (uint)(iVar125 < iVar135) * iVar135 | (uint)(iVar125 >= iVar135) * iVar125;
  auVar68._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar68._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar68._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar68._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar127 < iVar135) * iVar135 | (uint)(iVar127 >= iVar135) * iVar127;
  uVar171 = (uint)(iVar136 < iVar135) * iVar135 | (uint)(iVar136 >= iVar135) * iVar136;
  uVar174 = (uint)(iVar143 < iVar135) * iVar135 | (uint)(iVar143 >= iVar135) * iVar143;
  uVar177 = (uint)(iVar163 < iVar135) * iVar135 | (uint)(iVar163 >= iVar135) * iVar163;
  auVar42._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar42._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar42._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar42._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar96 = pmulld(auVar100,auVar42);
  auVar65 = pmulld(auVar42,auVar30);
  auVar66 = pmulld(auVar68,auVar100);
  auVar132 = pmulld(auVar68,auVar30);
  uVar164 = (uint)(iVar129 < iVar135) * iVar135 | (uint)(iVar129 >= iVar135) * iVar129;
  uVar171 = (uint)(iVar141 < iVar135) * iVar135 | (uint)(iVar141 >= iVar135) * iVar141;
  uVar174 = (uint)(iVar145 < iVar135) * iVar135 | (uint)(iVar145 >= iVar135) * iVar145;
  uVar177 = (uint)(iVar170 < iVar135) * iVar135 | (uint)(iVar170 >= iVar135) * iVar170;
  auVar155._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar155._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar155._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar155._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar147 < iVar135) * iVar135 | (uint)(iVar147 >= iVar135) * iVar147;
  uVar171 = (uint)(iVar149 < iVar135) * iVar135 | (uint)(iVar149 >= iVar135) * iVar149;
  uVar174 = (uint)(iVar131 < iVar135) * iVar135 | (uint)(iVar131 >= iVar135) * iVar131;
  uVar177 = (uint)(iVar133 < iVar135) * iVar135 | (uint)(iVar133 >= iVar135) * iVar133;
  auVar166._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar166._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar166._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar166._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar112 = pmulld(auVar30,auVar166);
  auVar9 = pmulld(auVar166,auVar181);
  auVar187 = pmulld(auVar181,auVar155);
  auVar148 = pmulld(auVar155,auVar30);
  uVar164 = (uint)(iVar26 < iVar135) * iVar135 | (uint)(iVar26 >= iVar135) * iVar26;
  uVar171 = (uint)(iVar75 < iVar135) * iVar135 | (uint)(iVar75 >= iVar135) * iVar75;
  uVar174 = (uint)(iVar152 < iVar135) * iVar135 | (uint)(iVar152 >= iVar135) * iVar152;
  uVar177 = (uint)(iVar159 < iVar135) * iVar135 | (uint)(iVar159 >= iVar135) * iVar159;
  auVar189._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar189._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar189._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar189._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar15 < iVar135) * iVar135 | (uint)(iVar15 >= iVar135) * iVar15;
  uVar171 = (uint)(iVar193 < iVar135) * iVar135 | (uint)(iVar193 >= iVar135) * iVar193;
  uVar174 = (uint)(iVar20 < iVar135) * iVar135 | (uint)(iVar20 >= iVar135) * iVar20;
  uVar177 = (uint)(iVar195 < iVar135) * iVar135 | (uint)(iVar195 >= iVar135) * iVar195;
  auVar169._0_4_ = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  auVar169._4_4_ = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  auVar169._8_4_ = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  auVar169._12_4_ = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar39 = pmulld(auVar169,auVar30);
  auVar51 = pmulld(auVar30,auVar189);
  auVar188 = pmulld(auVar189,auVar100);
  auVar166 = pmulld(auVar169,auVar100);
  uVar164 = (uint)(iVar4 < iVar135) * iVar135 | (uint)(iVar4 >= iVar135) * iVar4;
  uVar171 = (uint)(iVar21 < iVar135) * iVar135 | (uint)(iVar21 >= iVar135) * iVar21;
  uVar174 = (uint)(iVar27 < iVar135) * iVar135 | (uint)(iVar27 >= iVar135) * iVar27;
  uVar177 = (uint)(iVar82 < iVar135) * iVar135 | (uint)(iVar82 >= iVar135) * iVar82;
  uVar94 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar102 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar105 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar108 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar6 < iVar135) * iVar135 | (uint)(iVar6 >= iVar135) * iVar6;
  uVar171 = (uint)(iVar13 < iVar135) * iVar135 | (uint)(iVar13 >= iVar135) * iVar13;
  uVar174 = (uint)(iVar33 < iVar135) * iVar135 | (uint)(iVar33 >= iVar135) * iVar33;
  uVar177 = (uint)(iVar87 < iVar135) * iVar135 | (uint)(iVar87 >= iVar135) * iVar87;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  iVar82 = uVar164 + uVar94;
  iVar87 = uVar171 + uVar102;
  iVar104 = uVar174 + uVar105;
  iVar107 = uVar177 + uVar108;
  iVar59 = uVar94 - uVar164;
  iVar62 = uVar102 - uVar171;
  iVar75 = uVar105 - uVar174;
  iVar152 = uVar108 - uVar177;
  uVar164 = (uint)(iVar5 < iVar135) * iVar135 | (uint)(iVar5 >= iVar135) * iVar5;
  uVar171 = (uint)(iVar22 < iVar135) * iVar135 | (uint)(iVar22 >= iVar135) * iVar22;
  uVar174 = (uint)(iVar31 < iVar135) * iVar135 | (uint)(iVar31 >= iVar135) * iVar31;
  uVar177 = (uint)(iVar78 < iVar135) * iVar135 | (uint)(iVar78 >= iVar135) * iVar78;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar94 = (uint)(iVar25 < iVar135) * iVar135 | (uint)(iVar25 >= iVar135) * iVar25;
  uVar102 = (uint)(iVar71 < iVar135) * iVar135 | (uint)(iVar71 >= iVar135) * iVar71;
  uVar105 = (uint)(iVar79 < iVar135) * iVar135 | (uint)(iVar79 >= iVar135) * iVar79;
  uVar108 = (uint)(iVar157 < iVar135) * iVar135 | (uint)(iVar157 >= iVar135) * iVar157;
  uVar94 = (uint)(iVar151 < (int)uVar94) * iVar151 | (iVar151 >= (int)uVar94) * uVar94;
  uVar102 = (uint)(iVar151 < (int)uVar102) * iVar151 | (iVar151 >= (int)uVar102) * uVar102;
  uVar105 = (uint)(iVar151 < (int)uVar105) * iVar151 | (iVar151 >= (int)uVar105) * uVar105;
  uVar108 = (uint)(iVar151 < (int)uVar108) * iVar151 | (iVar151 >= (int)uVar108) * uVar108;
  iVar27 = uVar94 + uVar164;
  iVar31 = uVar102 + uVar171;
  iVar33 = uVar105 + uVar174;
  iVar78 = uVar108 + uVar177;
  iVar147 = uVar164 - uVar94;
  iVar133 = uVar171 - uVar102;
  iVar6 = uVar174 - uVar105;
  iVar13 = uVar177 - uVar108;
  iVar127 = auVar52._0_4_ + iVar3 + auVar123._0_4_ >> auVar40;
  iVar136 = auVar52._4_4_ + iVar3 + auVar123._4_4_ >> auVar40;
  iVar143 = auVar52._8_4_ + iVar3 + auVar123._8_4_ >> auVar40;
  iVar163 = auVar52._12_4_ + iVar3 + auVar123._12_4_ >> auVar40;
  iVar173 = (auVar138._0_4_ + iVar3) - auVar84._0_4_ >> auVar40;
  iVar176 = (auVar138._4_4_ + iVar3) - auVar84._4_4_ >> auVar40;
  iVar8 = (auVar138._8_4_ + iVar3) - auVar84._8_4_ >> auVar40;
  iVar191 = (auVar138._12_4_ + iVar3) - auVar84._12_4_ >> auVar40;
  iVar150 = auVar66._0_4_ + iVar3 + auVar65._0_4_ >> auVar40;
  iVar131 = auVar66._4_4_ + iVar3 + auVar65._4_4_ >> auVar40;
  iVar4 = auVar66._8_4_ + iVar3 + auVar65._8_4_ >> auVar40;
  iVar5 = auVar66._12_4_ + iVar3 + auVar65._12_4_ >> auVar40;
  iVar21 = (auVar132._0_4_ + iVar3) - auVar96._0_4_ >> auVar40;
  iVar22 = (auVar132._4_4_ + iVar3) - auVar96._4_4_ >> auVar40;
  iVar110 = (auVar132._8_4_ + iVar3) - auVar96._8_4_ >> auVar40;
  iVar115 = (auVar132._12_4_ + iVar3) - auVar96._12_4_ >> auVar40;
  iVar149 = iVar150 + iVar127;
  iVar134 = iVar131 + iVar136;
  iVar7 = iVar4 + iVar143;
  iVar14 = iVar5 + iVar163;
  iVar127 = iVar127 - iVar150;
  iVar136 = iVar136 - iVar131;
  iVar143 = iVar143 - iVar4;
  iVar163 = iVar163 - iVar5;
  iVar129 = iVar21 + iVar173;
  iVar141 = iVar22 + iVar176;
  iVar145 = iVar110 + iVar8;
  iVar170 = iVar115 + iVar191;
  iVar173 = iVar173 - iVar21;
  iVar176 = iVar176 - iVar22;
  iVar8 = iVar8 - iVar110;
  iVar191 = iVar191 - iVar115;
  uVar164 = (uint)(iVar11 < iVar135) * iVar135 | (uint)(iVar11 >= iVar135) * iVar11;
  uVar171 = (uint)(iVar18 < iVar135) * iVar135 | (uint)(iVar18 >= iVar135) * iVar18;
  uVar174 = (uint)(iVar35 < iVar135) * iVar135 | (uint)(iVar35 >= iVar135) * iVar35;
  uVar177 = (uint)(iVar89 < iVar135) * iVar135 | (uint)(iVar89 >= iVar135) * iVar89;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar94 = (uint)(iVar16 < iVar135) * iVar135 | (uint)(iVar16 >= iVar135) * iVar16;
  uVar102 = (uint)(iVar23 < iVar135) * iVar135 | (uint)(iVar23 >= iVar135) * iVar23;
  uVar105 = (uint)(iVar70 < iVar135) * iVar135 | (uint)(iVar70 >= iVar135) * iVar70;
  uVar108 = (uint)(iVar93 < iVar135) * iVar135 | (uint)(iVar93 >= iVar135) * iVar93;
  uVar94 = (uint)(iVar151 < (int)uVar94) * iVar151 | (iVar151 >= (int)uVar94) * uVar94;
  uVar102 = (uint)(iVar151 < (int)uVar102) * iVar151 | (iVar151 >= (int)uVar102) * uVar102;
  uVar105 = (uint)(iVar151 < (int)uVar105) * iVar151 | (iVar151 >= (int)uVar105) * uVar105;
  uVar108 = (uint)(iVar151 < (int)uVar108) * iVar151 | (iVar151 >= (int)uVar108) * uVar108;
  iVar117 = uVar94 + uVar164;
  iVar119 = uVar102 + uVar171;
  iVar121 = uVar105 + uVar174;
  iVar125 = uVar108 + uVar177;
  iVar150 = uVar164 - uVar94;
  iVar4 = uVar171 - uVar102;
  iVar11 = uVar174 - uVar105;
  iVar16 = uVar177 - uVar108;
  uVar164 = (uint)(iVar12 < iVar135) * iVar135 | (uint)(iVar12 >= iVar135) * iVar12;
  uVar171 = (uint)(iVar19 < iVar135) * iVar135 | (uint)(iVar19 >= iVar135) * iVar19;
  uVar174 = (uint)(iVar61 < iVar135) * iVar135 | (uint)(iVar61 >= iVar135) * iVar61;
  uVar177 = (uint)(iVar91 < iVar135) * iVar135 | (uint)(iVar91 >= iVar135) * iVar91;
  uVar94 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar102 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar105 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar108 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  uVar164 = (uint)(iVar17 < iVar135) * iVar135 | (uint)(iVar17 >= iVar135) * iVar17;
  uVar171 = (uint)(iVar24 < iVar135) * iVar135 | (uint)(iVar24 >= iVar135) * iVar24;
  uVar174 = (uint)(iVar74 < iVar135) * iVar135 | (uint)(iVar74 >= iVar135) * iVar74;
  uVar177 = (uint)(iVar101 < iVar135) * iVar135 | (uint)(iVar101 >= iVar135) * iVar101;
  uVar164 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar171 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar174 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar177 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  iVar93 = uVar164 + uVar94;
  iVar101 = uVar171 + uVar102;
  iVar110 = uVar174 + uVar105;
  iVar115 = uVar177 + uVar108;
  iVar70 = uVar94 - uVar164;
  iVar74 = uVar102 - uVar171;
  iVar89 = uVar105 - uVar174;
  iVar91 = uVar108 - uVar177;
  iVar15 = auVar148._0_4_ + iVar3 + auVar9._0_4_ >> auVar40;
  iVar193 = auVar148._4_4_ + iVar3 + auVar9._4_4_ >> auVar40;
  iVar20 = auVar148._8_4_ + iVar3 + auVar9._8_4_ >> auVar40;
  iVar195 = auVar148._12_4_ + iVar3 + auVar9._12_4_ >> auVar40;
  iVar25 = (auVar187._0_4_ + iVar3) - auVar112._0_4_ >> auVar40;
  iVar26 = (auVar187._4_4_ + iVar3) - auVar112._4_4_ >> auVar40;
  iVar55 = (auVar187._8_4_ + iVar3) - auVar112._8_4_ >> auVar40;
  iVar57 = (auVar187._12_4_ + iVar3) - auVar112._12_4_ >> auVar40;
  iVar23 = auVar188._0_4_ + iVar3 + auVar39._0_4_ >> auVar40;
  iVar24 = auVar188._4_4_ + iVar3 + auVar39._4_4_ >> auVar40;
  iVar35 = auVar188._8_4_ + iVar3 + auVar39._8_4_ >> auVar40;
  iVar61 = auVar188._12_4_ + iVar3 + auVar39._12_4_ >> auVar40;
  iVar18 = (auVar51._0_4_ + iVar3) - auVar166._0_4_ >> auVar40;
  iVar19 = (auVar51._4_4_ + iVar3) - auVar166._4_4_ >> auVar40;
  iVar21 = (auVar51._8_4_ + iVar3) - auVar166._8_4_ >> auVar40;
  iVar22 = (auVar51._12_4_ + iVar3) - auVar166._12_4_ >> auVar40;
  iVar131 = iVar23 + iVar15;
  iVar5 = iVar24 + iVar193;
  iVar12 = iVar35 + iVar20;
  iVar17 = iVar61 + iVar195;
  iVar15 = iVar15 - iVar23;
  iVar193 = iVar193 - iVar24;
  iVar20 = iVar20 - iVar35;
  iVar195 = iVar195 - iVar61;
  iVar23 = iVar18 + iVar25;
  iVar24 = iVar19 + iVar26;
  iVar35 = iVar21 + iVar55;
  iVar61 = iVar22 + iVar57;
  iVar25 = iVar25 - iVar18;
  iVar26 = iVar26 - iVar19;
  iVar55 = iVar55 - iVar21;
  iVar57 = iVar57 - iVar22;
  uVar94 = (uint)(iVar82 < iVar135) * iVar135 | (uint)(iVar82 >= iVar135) * iVar82;
  uVar102 = (uint)(iVar87 < iVar135) * iVar135 | (uint)(iVar87 >= iVar135) * iVar87;
  uVar105 = (uint)(iVar104 < iVar135) * iVar135 | (uint)(iVar104 >= iVar135) * iVar104;
  uVar108 = (uint)(iVar107 < iVar135) * iVar135 | (uint)(iVar107 >= iVar135) * iVar107;
  uVar186 = (uint)(iVar59 < iVar135) * iVar135 | (uint)(iVar59 >= iVar135) * iVar59;
  uVar192 = (uint)(iVar62 < iVar135) * iVar135 | (uint)(iVar62 >= iVar135) * iVar62;
  uVar194 = (uint)(iVar75 < iVar135) * iVar135 | (uint)(iVar75 >= iVar135) * iVar75;
  uVar196 = (uint)(iVar152 < iVar135) * iVar135 | (uint)(iVar152 >= iVar135) * iVar152;
  uVar37 = (uint)(iVar27 < iVar135) * iVar135 | (uint)(iVar27 >= iVar135) * iVar27;
  uVar44 = (uint)(iVar31 < iVar135) * iVar135 | (uint)(iVar31 >= iVar135) * iVar31;
  uVar46 = (uint)(iVar33 < iVar135) * iVar135 | (uint)(iVar33 >= iVar135) * iVar33;
  uVar48 = (uint)(iVar78 < iVar135) * iVar135 | (uint)(iVar78 >= iVar135) * iVar78;
  uVar38 = (uint)(iVar147 < iVar135) * iVar135 | (uint)(iVar147 >= iVar135) * iVar147;
  uVar45 = (uint)(iVar133 < iVar135) * iVar135 | (uint)(iVar133 >= iVar135) * iVar133;
  uVar47 = (uint)(iVar6 < iVar135) * iVar135 | (uint)(iVar6 >= iVar135) * iVar6;
  uVar49 = (uint)(iVar13 < iVar135) * iVar135 | (uint)(iVar13 >= iVar135) * iVar13;
  uVar165 = (uint)(iVar149 < iVar135) * iVar135 | (uint)(iVar149 >= iVar135) * iVar149;
  uVar172 = (uint)(iVar134 < iVar135) * iVar135 | (uint)(iVar134 >= iVar135) * iVar134;
  uVar175 = (uint)(iVar7 < iVar135) * iVar135 | (uint)(iVar7 >= iVar135) * iVar7;
  uVar178 = (uint)(iVar14 < iVar135) * iVar135 | (uint)(iVar14 >= iVar135) * iVar14;
  uVar63 = (uint)(iVar127 < iVar135) * iVar135 | (uint)(iVar127 >= iVar135) * iVar127;
  uVar72 = (uint)(iVar136 < iVar135) * iVar135 | (uint)(iVar136 >= iVar135) * iVar136;
  uVar76 = (uint)(iVar143 < iVar135) * iVar135 | (uint)(iVar143 >= iVar135) * iVar143;
  uVar80 = (uint)(iVar163 < iVar135) * iVar135 | (uint)(iVar163 >= iVar135) * iVar163;
  uVar122 = (uint)(iVar129 < iVar135) * iVar135 | (uint)(iVar129 >= iVar135) * iVar129;
  uVar126 = (uint)(iVar141 < iVar135) * iVar135 | (uint)(iVar141 >= iVar135) * iVar141;
  uVar128 = (uint)(iVar145 < iVar135) * iVar135 | (uint)(iVar145 >= iVar135) * iVar145;
  uVar130 = (uint)(iVar170 < iVar135) * iVar135 | (uint)(iVar170 >= iVar135) * iVar170;
  uVar137 = (uint)(iVar173 < iVar135) * iVar135 | (uint)(iVar173 >= iVar135) * iVar173;
  uVar142 = (uint)(iVar176 < iVar135) * iVar135 | (uint)(iVar176 >= iVar135) * iVar176;
  uVar144 = (uint)(iVar8 < iVar135) * iVar135 | (uint)(iVar8 >= iVar135) * iVar8;
  uVar146 = (uint)(iVar191 < iVar135) * iVar135 | (uint)(iVar191 >= iVar135) * iVar191;
  uVar111 = (uint)(iVar117 < iVar135) * iVar135 | (uint)(iVar117 >= iVar135) * iVar117;
  uVar116 = (uint)(iVar119 < iVar135) * iVar135 | (uint)(iVar119 >= iVar135) * iVar119;
  uVar118 = (uint)(iVar121 < iVar135) * iVar135 | (uint)(iVar121 >= iVar135) * iVar121;
  uVar120 = (uint)(iVar125 < iVar135) * iVar135 | (uint)(iVar125 >= iVar135) * iVar125;
  uVar64 = (uint)(iVar150 < iVar135) * iVar135 | (uint)(iVar150 >= iVar135) * iVar150;
  uVar73 = (uint)(iVar4 < iVar135) * iVar135 | (uint)(iVar4 >= iVar135) * iVar4;
  uVar77 = (uint)(iVar11 < iVar135) * iVar135 | (uint)(iVar11 >= iVar135) * iVar11;
  uVar81 = (uint)(iVar16 < iVar135) * iVar135 | (uint)(iVar16 >= iVar135) * iVar16;
  uVar95 = (uint)(iVar93 < iVar135) * iVar135 | (uint)(iVar93 >= iVar135) * iVar93;
  uVar103 = (uint)(iVar101 < iVar135) * iVar135 | (uint)(iVar101 >= iVar135) * iVar101;
  uVar106 = (uint)(iVar110 < iVar135) * iVar135 | (uint)(iVar110 >= iVar135) * iVar110;
  uVar109 = (uint)(iVar115 < iVar135) * iVar135 | (uint)(iVar115 >= iVar135) * iVar115;
  uVar83 = (uint)(iVar70 < iVar135) * iVar135 | (uint)(iVar70 >= iVar135) * iVar70;
  uVar88 = (uint)(iVar74 < iVar135) * iVar135 | (uint)(iVar74 >= iVar135) * iVar74;
  uVar90 = (uint)(iVar89 < iVar135) * iVar135 | (uint)(iVar89 >= iVar135) * iVar89;
  uVar92 = (uint)(iVar91 < iVar135) * iVar135 | (uint)(iVar91 >= iVar135) * iVar91;
  uVar164 = (uint)(iVar131 < iVar135) * iVar135 | (uint)(iVar131 >= iVar135) * iVar131;
  uVar171 = (uint)(iVar5 < iVar135) * iVar135 | (uint)(iVar5 >= iVar135) * iVar5;
  uVar174 = (uint)(iVar12 < iVar135) * iVar135 | (uint)(iVar12 >= iVar135) * iVar12;
  uVar177 = (uint)(iVar17 < iVar135) * iVar135 | (uint)(iVar17 >= iVar135) * iVar17;
  uVar153 = (uint)(iVar15 < iVar135) * iVar135 | (uint)(iVar15 >= iVar135) * iVar15;
  uVar158 = (uint)(iVar193 < iVar135) * iVar135 | (uint)(iVar193 >= iVar135) * iVar193;
  uVar160 = (uint)(iVar20 < iVar135) * iVar135 | (uint)(iVar20 >= iVar135) * iVar20;
  uVar162 = (uint)(iVar195 < iVar135) * iVar135 | (uint)(iVar195 >= iVar135) * iVar195;
  uVar50 = (uint)(iVar23 < iVar135) * iVar135 | (uint)(iVar23 >= iVar135) * iVar23;
  uVar56 = (uint)(iVar24 < iVar135) * iVar135 | (uint)(iVar24 >= iVar135) * iVar24;
  uVar58 = (uint)(iVar35 < iVar135) * iVar135 | (uint)(iVar35 >= iVar135) * iVar35;
  uVar60 = (uint)(iVar61 < iVar135) * iVar135 | (uint)(iVar61 >= iVar135) * iVar61;
  uVar179 = (uint)(iVar25 < iVar135) * iVar135 | (uint)(iVar25 >= iVar135) * iVar25;
  uVar183 = (uint)(iVar26 < iVar135) * iVar135 | (uint)(iVar26 >= iVar135) * iVar26;
  uVar184 = (uint)(iVar55 < iVar135) * iVar135 | (uint)(iVar55 >= iVar135) * iVar55;
  uVar185 = (uint)(iVar57 < iVar135) * iVar135 | (uint)(iVar57 >= iVar135) * iVar57;
  uVar28 = (uint)(iVar151 < (int)uVar94) * iVar151 | (iVar151 >= (int)uVar94) * uVar94;
  uVar32 = (uint)(iVar151 < (int)uVar102) * iVar151 | (iVar151 >= (int)uVar102) * uVar102;
  uVar34 = (uint)(iVar151 < (int)uVar105) * iVar151 | (iVar151 >= (int)uVar105) * uVar105;
  uVar36 = (uint)(iVar151 < (int)uVar108) * iVar151 | (iVar151 >= (int)uVar108) * uVar108;
  auVar190._0_4_ = (uint)(iVar151 < (int)uVar186) * iVar151 | (iVar151 >= (int)uVar186) * uVar186;
  auVar190._4_4_ = (uint)(iVar151 < (int)uVar192) * iVar151 | (iVar151 >= (int)uVar192) * uVar192;
  auVar190._8_4_ = (uint)(iVar151 < (int)uVar194) * iVar151 | (iVar151 >= (int)uVar194) * uVar194;
  auVar190._12_4_ = (uint)(iVar151 < (int)uVar196) * iVar151 | (iVar151 >= (int)uVar196) * uVar196;
  uVar94 = (uint)(iVar151 < (int)uVar37) * iVar151 | (iVar151 >= (int)uVar37) * uVar37;
  uVar102 = (uint)(iVar151 < (int)uVar44) * iVar151 | (iVar151 >= (int)uVar44) * uVar44;
  uVar105 = (uint)(iVar151 < (int)uVar46) * iVar151 | (iVar151 >= (int)uVar46) * uVar46;
  uVar108 = (uint)(iVar151 < (int)uVar48) * iVar151 | (iVar151 >= (int)uVar48) * uVar48;
  auVar10._0_4_ = (uint)(iVar151 < (int)uVar38) * iVar151 | (iVar151 >= (int)uVar38) * uVar38;
  auVar10._4_4_ = (uint)(iVar151 < (int)uVar45) * iVar151 | (iVar151 >= (int)uVar45) * uVar45;
  auVar10._8_4_ = (uint)(iVar151 < (int)uVar47) * iVar151 | (iVar151 >= (int)uVar47) * uVar47;
  auVar10._12_4_ = (uint)(iVar151 < (int)uVar49) * iVar151 | (iVar151 >= (int)uVar49) * uVar49;
  uVar37 = (uint)(iVar151 < (int)uVar165) * iVar151 | (iVar151 >= (int)uVar165) * uVar165;
  uVar38 = (uint)(iVar151 < (int)uVar172) * iVar151 | (iVar151 >= (int)uVar172) * uVar172;
  uVar44 = (uint)(iVar151 < (int)uVar175) * iVar151 | (iVar151 >= (int)uVar175) * uVar175;
  uVar45 = (uint)(iVar151 < (int)uVar178) * iVar151 | (iVar151 >= (int)uVar178) * uVar178;
  auVar43._0_4_ = (uint)(iVar151 < (int)uVar63) * iVar151 | (iVar151 >= (int)uVar63) * uVar63;
  auVar43._4_4_ = (uint)(iVar151 < (int)uVar72) * iVar151 | (iVar151 >= (int)uVar72) * uVar72;
  auVar43._8_4_ = (uint)(iVar151 < (int)uVar76) * iVar151 | (iVar151 >= (int)uVar76) * uVar76;
  auVar43._12_4_ = (uint)(iVar151 < (int)uVar80) * iVar151 | (iVar151 >= (int)uVar80) * uVar80;
  uVar46 = (uint)(iVar151 < (int)uVar122) * iVar151 | (iVar151 >= (int)uVar122) * uVar122;
  uVar47 = (uint)(iVar151 < (int)uVar126) * iVar151 | (iVar151 >= (int)uVar126) * uVar126;
  uVar48 = (uint)(iVar151 < (int)uVar128) * iVar151 | (iVar151 >= (int)uVar128) * uVar128;
  uVar49 = (uint)(iVar151 < (int)uVar130) * iVar151 | (iVar151 >= (int)uVar130) * uVar130;
  auVar140._0_4_ = (uint)(iVar151 < (int)uVar137) * iVar151 | (iVar151 >= (int)uVar137) * uVar137;
  auVar140._4_4_ = (uint)(iVar151 < (int)uVar142) * iVar151 | (iVar151 >= (int)uVar142) * uVar142;
  auVar140._8_4_ = (uint)(iVar151 < (int)uVar144) * iVar151 | (iVar151 >= (int)uVar144) * uVar144;
  auVar140._12_4_ = (uint)(iVar151 < (int)uVar146) * iVar151 | (iVar151 >= (int)uVar146) * uVar146;
  uVar76 = (uint)(iVar151 < (int)uVar111) * iVar151 | (iVar151 >= (int)uVar111) * uVar111;
  uVar80 = (uint)(iVar151 < (int)uVar116) * iVar151 | (iVar151 >= (int)uVar116) * uVar116;
  uVar111 = (uint)(iVar151 < (int)uVar118) * iVar151 | (iVar151 >= (int)uVar118) * uVar118;
  uVar116 = (uint)(iVar151 < (int)uVar120) * iVar151 | (iVar151 >= (int)uVar120) * uVar120;
  auVar69._0_4_ = (uint)(iVar151 < (int)uVar64) * iVar151 | (iVar151 >= (int)uVar64) * uVar64;
  auVar69._4_4_ = (uint)(iVar151 < (int)uVar73) * iVar151 | (iVar151 >= (int)uVar73) * uVar73;
  auVar69._8_4_ = (uint)(iVar151 < (int)uVar77) * iVar151 | (iVar151 >= (int)uVar77) * uVar77;
  auVar69._12_4_ = (uint)(iVar151 < (int)uVar81) * iVar151 | (iVar151 >= (int)uVar81) * uVar81;
  uVar63 = (uint)(iVar151 < (int)uVar95) * iVar151 | (iVar151 >= (int)uVar95) * uVar95;
  uVar64 = (uint)(iVar151 < (int)uVar103) * iVar151 | (iVar151 >= (int)uVar103) * uVar103;
  uVar72 = (uint)(iVar151 < (int)uVar106) * iVar151 | (iVar151 >= (int)uVar106) * uVar106;
  uVar73 = (uint)(iVar151 < (int)uVar109) * iVar151 | (iVar151 >= (int)uVar109) * uVar109;
  auVar86._0_4_ = (uint)(iVar151 < (int)uVar83) * iVar151 | (iVar151 >= (int)uVar83) * uVar83;
  auVar86._4_4_ = (uint)(iVar151 < (int)uVar88) * iVar151 | (iVar151 >= (int)uVar88) * uVar88;
  auVar86._8_4_ = (uint)(iVar151 < (int)uVar90) * iVar151 | (iVar151 >= (int)uVar90) * uVar90;
  auVar86._12_4_ = (uint)(iVar151 < (int)uVar92) * iVar151 | (iVar151 >= (int)uVar92) * uVar92;
  uVar77 = (uint)(iVar151 < (int)uVar164) * iVar151 | (iVar151 >= (int)uVar164) * uVar164;
  uVar81 = (uint)(iVar151 < (int)uVar171) * iVar151 | (iVar151 >= (int)uVar171) * uVar171;
  uVar83 = (uint)(iVar151 < (int)uVar174) * iVar151 | (iVar151 >= (int)uVar174) * uVar174;
  uVar88 = (uint)(iVar151 < (int)uVar177) * iVar151 | (iVar151 >= (int)uVar177) * uVar177;
  auVar156._0_4_ = (uint)(iVar151 < (int)uVar153) * iVar151 | (iVar151 >= (int)uVar153) * uVar153;
  auVar156._4_4_ = (uint)(iVar151 < (int)uVar158) * iVar151 | (iVar151 >= (int)uVar158) * uVar158;
  auVar156._8_4_ = (uint)(iVar151 < (int)uVar160) * iVar151 | (iVar151 >= (int)uVar160) * uVar160;
  auVar156._12_4_ = (uint)(iVar151 < (int)uVar162) * iVar151 | (iVar151 >= (int)uVar162) * uVar162;
  uVar164 = (uint)(iVar151 < (int)uVar50) * iVar151 | (iVar151 >= (int)uVar50) * uVar50;
  uVar171 = (uint)(iVar151 < (int)uVar56) * iVar151 | (iVar151 >= (int)uVar56) * uVar56;
  uVar174 = (uint)(iVar151 < (int)uVar58) * iVar151 | (iVar151 >= (int)uVar58) * uVar58;
  uVar177 = (uint)(iVar151 < (int)uVar60) * iVar151 | (iVar151 >= (int)uVar60) * uVar60;
  auVar182._0_4_ = (uint)(iVar151 < (int)uVar179) * iVar151 | (iVar151 >= (int)uVar179) * uVar179;
  auVar182._4_4_ = (uint)(iVar151 < (int)uVar183) * iVar151 | (iVar151 >= (int)uVar183) * uVar183;
  auVar182._8_4_ = (uint)(iVar151 < (int)uVar184) * iVar151 | (iVar151 >= (int)uVar184) * uVar184;
  auVar182._12_4_ = (uint)(iVar151 < (int)uVar185) * iVar151 | (iVar151 >= (int)uVar185) * uVar185;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1e0);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar39 = pmulld(auVar190,auVar54);
  auVar9 = pmulld(auVar10,auVar54);
  iVar131 = auVar39._0_4_ + iVar3;
  iVar133 = auVar39._4_4_ + iVar3;
  iVar134 = auVar39._8_4_ + iVar3;
  iVar135 = auVar39._12_4_ + iVar3;
  auVar39 = pmulld(auVar43,auVar54);
  auVar52 = pmulld(auVar140,auVar54);
  iVar147 = auVar39._0_4_ + iVar3;
  iVar149 = auVar39._4_4_ + iVar3;
  iVar150 = auVar39._8_4_ + iVar3;
  iVar151 = auVar39._12_4_ + iVar3;
  auVar39 = pmulld(auVar69,auVar54);
  auVar51 = pmulld(auVar86,auVar54);
  iVar4 = auVar39._0_4_ + iVar3;
  iVar5 = auVar39._4_4_ + iVar3;
  iVar6 = auVar39._8_4_ + iVar3;
  iVar7 = auVar39._12_4_ + iVar3;
  auVar39 = pmulld(auVar156,auVar54);
  auVar65 = pmulld(auVar182,auVar54);
  iVar61 = auVar39._0_4_ + iVar3;
  iVar70 = auVar39._4_4_ + iVar3;
  iVar74 = auVar39._8_4_ + iVar3;
  iVar3 = auVar39._12_4_ + iVar3;
  iVar11 = iVar131 + auVar9._0_4_ >> auVar40;
  iVar12 = iVar133 + auVar9._4_4_ >> auVar40;
  iVar13 = iVar134 + auVar9._8_4_ >> auVar40;
  iVar14 = iVar135 + auVar9._12_4_ >> auVar40;
  iVar131 = iVar131 - auVar9._0_4_ >> auVar40;
  iVar133 = iVar133 - auVar9._4_4_ >> auVar40;
  iVar134 = iVar134 - auVar9._8_4_ >> auVar40;
  iVar135 = iVar135 - auVar9._12_4_ >> auVar40;
  iVar16 = iVar147 + auVar52._0_4_ >> auVar40;
  iVar17 = iVar149 + auVar52._4_4_ >> auVar40;
  iVar18 = iVar150 + auVar52._8_4_ >> auVar40;
  iVar19 = iVar151 + auVar52._12_4_ >> auVar40;
  iVar147 = iVar147 - auVar52._0_4_ >> auVar40;
  iVar149 = iVar149 - auVar52._4_4_ >> auVar40;
  iVar150 = iVar150 - auVar52._8_4_ >> auVar40;
  iVar151 = iVar151 - auVar52._12_4_ >> auVar40;
  iVar27 = iVar4 + auVar51._0_4_ >> auVar40;
  iVar31 = iVar5 + auVar51._4_4_ >> auVar40;
  iVar33 = iVar6 + auVar51._8_4_ >> auVar40;
  iVar35 = iVar7 + auVar51._12_4_ >> auVar40;
  iVar21 = iVar4 - auVar51._0_4_ >> auVar40;
  iVar22 = iVar5 - auVar51._4_4_ >> auVar40;
  iVar23 = iVar6 - auVar51._8_4_ >> auVar40;
  iVar24 = iVar7 - auVar51._12_4_ >> auVar40;
  iVar4 = iVar61 + auVar65._0_4_ >> auVar40;
  iVar5 = iVar70 + auVar65._4_4_ >> auVar40;
  iVar6 = iVar74 + auVar65._8_4_ >> auVar40;
  iVar7 = iVar3 + auVar65._12_4_ >> auVar40;
  uVar50 = iVar61 - auVar65._0_4_ >> auVar40;
  uVar56 = iVar70 - auVar65._4_4_ >> auVar40;
  uVar58 = iVar74 - auVar65._8_4_ >> auVar40;
  uVar60 = iVar3 - auVar65._12_4_ >> auVar40;
  if (do_cols == 0) {
    iVar3 = 10;
    if (10 < bd) {
      iVar3 = bd;
    }
    iVar3 = 0x20 << ((byte)iVar3 & 0x1f);
    iVar61 = -iVar3;
    iVar3 = iVar3 + -1;
    iVar87 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar40 = ZEXT416((uint)out_shift);
    iVar70 = (int)(uVar28 + iVar87) >> auVar40;
    iVar74 = (int)(uVar32 + iVar87) >> auVar40;
    iVar78 = (int)(uVar34 + iVar87) >> auVar40;
    iVar82 = (int)(uVar36 + iVar87) >> auVar40;
    iVar89 = (int)(iVar87 - uVar76) >> auVar40;
    iVar91 = (int)(iVar87 - uVar80) >> auVar40;
    iVar93 = (int)(iVar87 - uVar111) >> auVar40;
    iVar101 = (int)(iVar87 - uVar116) >> auVar40;
    uVar28 = (uint)(iVar70 < iVar61) * iVar61 | (uint)(iVar70 >= iVar61) * iVar70;
    uVar32 = (uint)(iVar74 < iVar61) * iVar61 | (uint)(iVar74 >= iVar61) * iVar74;
    uVar34 = (uint)(iVar78 < iVar61) * iVar61 | (uint)(iVar78 >= iVar61) * iVar78;
    uVar36 = (uint)(iVar82 < iVar61) * iVar61 | (uint)(iVar82 >= iVar61) * iVar82;
    *(uint *)*out = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)*out + 4) =
         (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)(*out + 1) = (uint)(iVar3 < (int)uVar34) * iVar3 | (iVar3 >= (int)uVar34) * uVar34;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
    uVar28 = (uint)(iVar89 < iVar61) * iVar61 | (uint)(iVar89 >= iVar61) * iVar89;
    uVar32 = (uint)(iVar91 < iVar61) * iVar61 | (uint)(iVar91 >= iVar61) * iVar91;
    uVar34 = (uint)(iVar93 < iVar61) * iVar61 | (uint)(iVar93 >= iVar61) * iVar93;
    uVar36 = (uint)(iVar101 < iVar61) * iVar61 | (uint)(iVar101 >= iVar61) * iVar101;
    *(uint *)out[1] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[1] + 4) =
         (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)(out[1] + 1) = (uint)(iVar3 < (int)uVar34) * iVar3 | (iVar3 >= (int)uVar34) * uVar34;
    *(uint *)((long)out[1] + 0xc) =
         (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
    iVar70 = (int)(uVar77 + iVar87) >> auVar40;
    iVar74 = (int)(uVar81 + iVar87) >> auVar40;
    iVar78 = (int)(uVar83 + iVar87) >> auVar40;
    iVar82 = (int)(uVar88 + iVar87) >> auVar40;
    uVar28 = (uint)(iVar70 < iVar61) * iVar61 | (uint)(iVar70 >= iVar61) * iVar70;
    uVar32 = (uint)(iVar74 < iVar61) * iVar61 | (uint)(iVar74 >= iVar61) * iVar74;
    uVar34 = (uint)(iVar78 < iVar61) * iVar61 | (uint)(iVar78 >= iVar61) * iVar78;
    uVar36 = (uint)(iVar82 < iVar61) * iVar61 | (uint)(iVar82 >= iVar61) * iVar82;
    *(uint *)out[2] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[2] + 4) =
         (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)(out[2] + 1) = (uint)(iVar3 < (int)uVar34) * iVar3 | (iVar3 >= (int)uVar34) * uVar34;
    *(uint *)((long)out[2] + 0xc) =
         (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
    iVar70 = (int)(iVar87 - uVar37) >> auVar40;
    iVar74 = (int)(iVar87 - uVar38) >> auVar40;
    iVar78 = (int)(iVar87 - uVar44) >> auVar40;
    iVar82 = (int)(iVar87 - uVar45) >> auVar40;
    uVar28 = (uint)(iVar70 < iVar61) * iVar61 | (uint)(iVar70 >= iVar61) * iVar70;
    uVar37 = (uint)(iVar74 < iVar61) * iVar61 | (uint)(iVar74 >= iVar61) * iVar74;
    uVar32 = (uint)(iVar78 < iVar61) * iVar61 | (uint)(iVar78 >= iVar61) * iVar78;
    uVar38 = (uint)(iVar82 < iVar61) * iVar61 | (uint)(iVar82 >= iVar61) * iVar82;
    *(uint *)out[3] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[3] + 4) =
         (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    *(uint *)(out[3] + 1) = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)((long)out[3] + 0xc) =
         (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    iVar16 = iVar16 + iVar87 >> auVar40;
    iVar17 = iVar17 + iVar87 >> auVar40;
    iVar18 = iVar18 + iVar87 >> auVar40;
    iVar19 = iVar19 + iVar87 >> auVar40;
    uVar28 = (uint)(iVar16 < iVar61) * iVar61 | (uint)(iVar16 >= iVar61) * iVar16;
    uVar37 = (uint)(iVar17 < iVar61) * iVar61 | (uint)(iVar17 >= iVar61) * iVar17;
    uVar32 = (uint)(iVar18 < iVar61) * iVar61 | (uint)(iVar18 >= iVar61) * iVar18;
    uVar38 = (uint)(iVar19 < iVar61) * iVar61 | (uint)(iVar19 >= iVar61) * iVar19;
    *(uint *)out[4] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[4] + 4) =
         (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    *(uint *)(out[4] + 1) = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)((long)out[4] + 0xc) =
         (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    iVar4 = iVar87 - iVar4 >> auVar40;
    iVar5 = iVar87 - iVar5 >> auVar40;
    iVar6 = iVar87 - iVar6 >> auVar40;
    iVar7 = iVar87 - iVar7 >> auVar40;
    uVar28 = (uint)(iVar4 < iVar61) * iVar61 | (uint)(iVar4 >= iVar61) * iVar4;
    uVar37 = (uint)(iVar5 < iVar61) * iVar61 | (uint)(iVar5 >= iVar61) * iVar5;
    uVar32 = (uint)(iVar6 < iVar61) * iVar61 | (uint)(iVar6 >= iVar61) * iVar6;
    uVar38 = (uint)(iVar7 < iVar61) * iVar61 | (uint)(iVar7 >= iVar61) * iVar7;
    *(uint *)out[5] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[5] + 4) =
         (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    *(uint *)(out[5] + 1) = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)((long)out[5] + 0xc) =
         (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    iVar4 = iVar27 + iVar87 >> auVar40;
    iVar5 = iVar31 + iVar87 >> auVar40;
    iVar6 = iVar33 + iVar87 >> auVar40;
    iVar7 = iVar35 + iVar87 >> auVar40;
    uVar28 = (uint)(iVar4 < iVar61) * iVar61 | (uint)(iVar4 >= iVar61) * iVar4;
    uVar37 = (uint)(iVar5 < iVar61) * iVar61 | (uint)(iVar5 >= iVar61) * iVar5;
    uVar32 = (uint)(iVar6 < iVar61) * iVar61 | (uint)(iVar6 >= iVar61) * iVar6;
    uVar38 = (uint)(iVar7 < iVar61) * iVar61 | (uint)(iVar7 >= iVar61) * iVar7;
    *(uint *)out[6] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[6] + 4) =
         (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    *(uint *)(out[6] + 1) = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)((long)out[6] + 0xc) =
         (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    iVar4 = iVar87 - iVar11 >> auVar40;
    iVar5 = iVar87 - iVar12 >> auVar40;
    iVar6 = iVar87 - iVar13 >> auVar40;
    iVar7 = iVar87 - iVar14 >> auVar40;
    uVar28 = (uint)(iVar4 < iVar61) * iVar61 | (uint)(iVar4 >= iVar61) * iVar4;
    uVar37 = (uint)(iVar5 < iVar61) * iVar61 | (uint)(iVar5 >= iVar61) * iVar5;
    uVar32 = (uint)(iVar6 < iVar61) * iVar61 | (uint)(iVar6 >= iVar61) * iVar6;
    uVar38 = (uint)(iVar7 < iVar61) * iVar61 | (uint)(iVar7 >= iVar61) * iVar7;
    *(uint *)out[7] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[7] + 4) =
         (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    *(uint *)(out[7] + 1) = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)((long)out[7] + 0xc) =
         (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    iVar4 = iVar131 + iVar87 >> auVar40;
    iVar5 = iVar133 + iVar87 >> auVar40;
    iVar6 = iVar134 + iVar87 >> auVar40;
    iVar7 = iVar135 + iVar87 >> auVar40;
    iVar131 = iVar87 - iVar21 >> auVar40;
    iVar133 = iVar87 - iVar22 >> auVar40;
    iVar134 = iVar87 - iVar23 >> auVar40;
    iVar135 = iVar87 - iVar24 >> auVar40;
    uVar28 = (uint)(iVar4 < iVar61) * iVar61 | (uint)(iVar4 >= iVar61) * iVar4;
    uVar37 = (uint)(iVar5 < iVar61) * iVar61 | (uint)(iVar5 >= iVar61) * iVar5;
    uVar32 = (uint)(iVar6 < iVar61) * iVar61 | (uint)(iVar6 >= iVar61) * iVar6;
    uVar38 = (uint)(iVar7 < iVar61) * iVar61 | (uint)(iVar7 >= iVar61) * iVar7;
    *(uint *)out[8] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[8] + 4) =
         (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    *(uint *)(out[8] + 1) = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)((long)out[8] + 0xc) =
         (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    uVar28 = (uint)(iVar131 < iVar61) * iVar61 | (uint)(iVar131 >= iVar61) * iVar131;
    uVar37 = (uint)(iVar133 < iVar61) * iVar61 | (uint)(iVar133 >= iVar61) * iVar133;
    uVar32 = (uint)(iVar134 < iVar61) * iVar61 | (uint)(iVar134 >= iVar61) * iVar134;
    uVar38 = (uint)(iVar135 < iVar61) * iVar61 | (uint)(iVar135 >= iVar61) * iVar135;
    *(uint *)out[9] = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    *(uint *)((long)out[9] + 4) =
         (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    *(uint *)(out[9] + 1) = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    *(uint *)((long)out[9] + 0xc) =
         (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    iVar16 = (int)(uVar50 + iVar87) >> auVar40;
    iVar17 = (int)(uVar56 + iVar87) >> auVar40;
    iVar18 = (int)(uVar58 + iVar87) >> auVar40;
    iVar19 = (int)(uVar60 + iVar87) >> auVar40;
    iVar147 = iVar87 - iVar147 >> auVar40;
    iVar149 = iVar87 - iVar149 >> auVar40;
    iVar150 = iVar87 - iVar150 >> auVar40;
    iVar151 = iVar87 - iVar151 >> auVar40;
    iVar4 = (int)(uVar46 + iVar87) >> auVar40;
    iVar5 = (int)(uVar47 + iVar87) >> auVar40;
    iVar6 = (int)(uVar48 + iVar87) >> auVar40;
    iVar7 = (int)(uVar49 + iVar87) >> auVar40;
    iVar131 = (int)(iVar87 - uVar164) >> auVar40;
    iVar133 = (int)(iVar87 - uVar171) >> auVar40;
    iVar134 = (int)(iVar87 - uVar174) >> auVar40;
    iVar135 = (int)(iVar87 - uVar177) >> auVar40;
    iVar21 = (int)(uVar63 + iVar87) >> auVar40;
    iVar22 = (int)(uVar64 + iVar87) >> auVar40;
    iVar23 = (int)(uVar72 + iVar87) >> auVar40;
    iVar24 = (int)(uVar73 + iVar87) >> auVar40;
    iVar11 = (int)(iVar87 - uVar94) >> auVar40;
    iVar12 = (int)(iVar87 - uVar102) >> auVar40;
    iVar13 = (int)(iVar87 - uVar105) >> auVar40;
    iVar14 = (int)(iVar87 - uVar108) >> auVar40;
    uVar28 = (uint)(iVar16 < iVar61) * iVar61 | (uint)(iVar16 >= iVar61) * iVar16;
    uVar37 = (uint)(iVar17 < iVar61) * iVar61 | (uint)(iVar17 >= iVar61) * iVar17;
    uVar32 = (uint)(iVar18 < iVar61) * iVar61 | (uint)(iVar18 >= iVar61) * iVar18;
    uVar38 = (uint)(iVar19 < iVar61) * iVar61 | (uint)(iVar19 >= iVar61) * iVar19;
    uVar164 = (uint)(iVar147 < iVar61) * iVar61 | (uint)(iVar147 >= iVar61) * iVar147;
    uVar171 = (uint)(iVar149 < iVar61) * iVar61 | (uint)(iVar149 >= iVar61) * iVar149;
    uVar174 = (uint)(iVar150 < iVar61) * iVar61 | (uint)(iVar150 >= iVar61) * iVar150;
    uVar177 = (uint)(iVar151 < iVar61) * iVar61 | (uint)(iVar151 >= iVar61) * iVar151;
    uVar34 = (uint)(iVar4 < iVar61) * iVar61 | (uint)(iVar4 >= iVar61) * iVar4;
    uVar44 = (uint)(iVar5 < iVar61) * iVar61 | (uint)(iVar5 >= iVar61) * iVar5;
    uVar36 = (uint)(iVar6 < iVar61) * iVar61 | (uint)(iVar6 >= iVar61) * iVar6;
    uVar45 = (uint)(iVar7 < iVar61) * iVar61 | (uint)(iVar7 >= iVar61) * iVar7;
    uVar94 = (uint)(iVar131 < iVar61) * iVar61 | (uint)(iVar131 >= iVar61) * iVar131;
    uVar102 = (uint)(iVar133 < iVar61) * iVar61 | (uint)(iVar133 >= iVar61) * iVar133;
    uVar105 = (uint)(iVar134 < iVar61) * iVar61 | (uint)(iVar134 >= iVar61) * iVar134;
    uVar108 = (uint)(iVar135 < iVar61) * iVar61 | (uint)(iVar135 >= iVar61) * iVar135;
    uVar63 = (uint)(iVar21 < iVar61) * iVar61 | (uint)(iVar21 >= iVar61) * iVar21;
    uVar64 = (uint)(iVar22 < iVar61) * iVar61 | (uint)(iVar22 >= iVar61) * iVar22;
    uVar72 = (uint)(iVar23 < iVar61) * iVar61 | (uint)(iVar23 >= iVar61) * iVar23;
    uVar73 = (uint)(iVar24 < iVar61) * iVar61 | (uint)(iVar24 >= iVar61) * iVar24;
    uVar76 = (uint)(iVar11 < iVar61) * iVar61 | (uint)(iVar11 >= iVar61) * iVar11;
    uVar77 = (uint)(iVar12 < iVar61) * iVar61 | (uint)(iVar12 >= iVar61) * iVar12;
    uVar80 = (uint)(iVar13 < iVar61) * iVar61 | (uint)(iVar13 >= iVar61) * iVar13;
    uVar81 = (uint)(iVar14 < iVar61) * iVar61 | (uint)(iVar14 >= iVar61) * iVar14;
    uVar50 = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
    uVar56 = (uint)(iVar3 < (int)uVar37) * iVar3 | (iVar3 >= (int)uVar37) * uVar37;
    uVar58 = (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
    uVar60 = (uint)(iVar3 < (int)uVar38) * iVar3 | (iVar3 >= (int)uVar38) * uVar38;
    uVar28 = (uint)(iVar3 < (int)uVar164) * iVar3 | (iVar3 >= (int)uVar164) * uVar164;
    uVar37 = (uint)(iVar3 < (int)uVar171) * iVar3 | (iVar3 >= (int)uVar171) * uVar171;
    uVar32 = (uint)(iVar3 < (int)uVar174) * iVar3 | (iVar3 >= (int)uVar174) * uVar174;
    uVar38 = (uint)(iVar3 < (int)uVar177) * iVar3 | (iVar3 >= (int)uVar177) * uVar177;
    uVar46 = (uint)(iVar3 < (int)uVar34) * iVar3 | (iVar3 >= (int)uVar34) * uVar34;
    uVar47 = (uint)(iVar3 < (int)uVar44) * iVar3 | (iVar3 >= (int)uVar44) * uVar44;
    uVar48 = (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
    uVar49 = (uint)(iVar3 < (int)uVar45) * iVar3 | (iVar3 >= (int)uVar45) * uVar45;
    uVar164 = (uint)(iVar3 < (int)uVar94) * iVar3 | (iVar3 >= (int)uVar94) * uVar94;
    uVar171 = (uint)(iVar3 < (int)uVar102) * iVar3 | (iVar3 >= (int)uVar102) * uVar102;
    uVar174 = (uint)(iVar3 < (int)uVar105) * iVar3 | (iVar3 >= (int)uVar105) * uVar105;
    uVar177 = (uint)(iVar3 < (int)uVar108) * iVar3 | (iVar3 >= (int)uVar108) * uVar108;
    uVar63 = (uint)(iVar3 < (int)uVar63) * iVar3 | (iVar3 >= (int)uVar63) * uVar63;
    uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
    uVar72 = (uint)(iVar3 < (int)uVar72) * iVar3 | (iVar3 >= (int)uVar72) * uVar72;
    uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
    uVar94 = (uint)(iVar3 < (int)uVar76) * iVar3 | (iVar3 >= (int)uVar76) * uVar76;
    uVar102 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
    uVar105 = (uint)(iVar3 < (int)uVar80) * iVar3 | (iVar3 >= (int)uVar80) * uVar80;
    uVar108 = (uint)(iVar3 < (int)uVar81) * iVar3 | (iVar3 >= (int)uVar81) * uVar81;
  }
  else {
    (*out)[0] = CONCAT44(uVar32,uVar28);
    (*out)[1] = CONCAT44(uVar36,uVar34);
    *(uint *)out[1] = -uVar76;
    *(uint *)((long)out[1] + 4) = -uVar80;
    *(uint *)(out[1] + 1) = -uVar111;
    *(uint *)((long)out[1] + 0xc) = -uVar116;
    *(uint *)out[2] = uVar77;
    *(uint *)((long)out[2] + 4) = uVar81;
    *(uint *)(out[2] + 1) = uVar83;
    *(uint *)((long)out[2] + 0xc) = uVar88;
    *(uint *)out[3] = -uVar37;
    *(uint *)((long)out[3] + 4) = -uVar38;
    *(uint *)(out[3] + 1) = -uVar44;
    *(uint *)((long)out[3] + 0xc) = -uVar45;
    *(int *)out[4] = iVar16;
    *(int *)((long)out[4] + 4) = iVar17;
    *(int *)(out[4] + 1) = iVar18;
    *(int *)((long)out[4] + 0xc) = iVar19;
    *(int *)out[5] = -iVar4;
    *(int *)((long)out[5] + 4) = -iVar5;
    *(int *)(out[5] + 1) = -iVar6;
    *(int *)((long)out[5] + 0xc) = -iVar7;
    *(int *)out[6] = iVar27;
    *(int *)((long)out[6] + 4) = iVar31;
    *(int *)(out[6] + 1) = iVar33;
    *(int *)((long)out[6] + 0xc) = iVar35;
    *(int *)out[7] = -iVar11;
    *(int *)((long)out[7] + 4) = -iVar12;
    *(int *)(out[7] + 1) = -iVar13;
    *(int *)((long)out[7] + 0xc) = -iVar14;
    *(int *)out[8] = iVar131;
    *(int *)((long)out[8] + 4) = iVar133;
    *(int *)(out[8] + 1) = iVar134;
    *(int *)((long)out[8] + 0xc) = iVar135;
    *(int *)out[9] = -iVar21;
    *(int *)((long)out[9] + 4) = -iVar22;
    *(int *)(out[9] + 1) = -iVar23;
    *(int *)((long)out[9] + 0xc) = -iVar24;
    uVar28 = -iVar147;
    uVar37 = -iVar149;
    uVar32 = -iVar150;
    uVar38 = -iVar151;
    uVar164 = -uVar164;
    uVar171 = -uVar171;
    uVar174 = -uVar174;
    uVar177 = -uVar177;
    uVar94 = -uVar94;
    uVar102 = -uVar102;
    uVar105 = -uVar105;
    uVar108 = -uVar108;
  }
  *(uint *)out[10] = uVar50;
  *(uint *)((long)out[10] + 4) = uVar56;
  *(uint *)(out[10] + 1) = uVar58;
  *(uint *)((long)out[10] + 0xc) = uVar60;
  *(uint *)out[0xb] = uVar28;
  *(uint *)((long)out[0xb] + 4) = uVar37;
  *(uint *)(out[0xb] + 1) = uVar32;
  *(uint *)((long)out[0xb] + 0xc) = uVar38;
  *(uint *)out[0xc] = uVar46;
  *(uint *)((long)out[0xc] + 4) = uVar47;
  *(uint *)(out[0xc] + 1) = uVar48;
  *(uint *)((long)out[0xc] + 0xc) = uVar49;
  *(uint *)out[0xd] = uVar164;
  *(uint *)((long)out[0xd] + 4) = uVar171;
  *(uint *)(out[0xd] + 1) = uVar174;
  *(uint *)((long)out[0xd] + 0xc) = uVar177;
  *(uint *)out[0xe] = uVar63;
  *(uint *)((long)out[0xe] + 4) = uVar64;
  *(uint *)(out[0xe] + 1) = uVar72;
  *(uint *)((long)out[0xe] + 0xc) = uVar73;
  *(uint *)out[0xf] = uVar94;
  *(uint *)((long)out[0xf] + 4) = uVar102;
  *(uint *)(out[0xf] + 1) = uVar105;
  *(uint *)((long)out[0xf] + 0xc) = uVar108;
  return;
}

Assistant:

static void iadst16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi34 = _mm_set1_epi32(cospi[34]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi42 = _mm_set1_epi32(cospi[42]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi50 = _mm_set1_epi32(cospi[50]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi58 = _mm_set1_epi32(cospi[58]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i zero = _mm_setzero_si128();
  __m128i u[16], x, y;

  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  u[1] = _mm_sub_epi32(zero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  x = _mm_mullo_epi32(in[2], cospi54);
  u[2] = _mm_add_epi32(x, rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  x = _mm_mullo_epi32(in[2], cospi10);
  u[3] = _mm_sub_epi32(zero, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  x = _mm_mullo_epi32(in[4], cospi46);
  u[4] = _mm_add_epi32(x, rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(in[4], cospi18);
  u[5] = _mm_sub_epi32(zero, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(in[6], cospi38);
  u[6] = _mm_add_epi32(x, rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(in[6], cospi26);
  u[7] = _mm_sub_epi32(zero, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  u[8] = _mm_mullo_epi32(in[7], cospi34);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  u[9] = _mm_mullo_epi32(in[7], cospi30);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  u[10] = _mm_mullo_epi32(in[5], cospi42);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_mullo_epi32(in[5], cospi22);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_mullo_epi32(in[3], cospi50);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  u[13] = _mm_mullo_epi32(in[3], cospi14);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  u[14] = _mm_mullo_epi32(in[1], cospi58);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_mullo_epi32(in[1], cospi6);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 3
  addsub_sse4_1(u[0], u[8], &u[0], &u[8], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[9], &u[1], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[10], &u[2], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[11], &u[3], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[12], &u[4], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[13], &u[5], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[14], &u[6], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[15], &u[7], &u[15], &clamp_lo, &clamp_hi);

  // stage 4
  y = _mm_mullo_epi32(u[8], cospi56);
  x = _mm_mullo_epi32(u[9], cospi56);
  u[8] = _mm_mullo_epi32(u[8], cospi8);
  u[8] = _mm_add_epi32(u[8], x);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  x = _mm_mullo_epi32(u[9], cospi8);
  u[9] = _mm_sub_epi32(y, x);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  x = _mm_mullo_epi32(u[11], cospi24);
  y = _mm_mullo_epi32(u[10], cospi24);
  u[10] = _mm_mullo_epi32(u[10], cospi40);
  u[10] = _mm_add_epi32(u[10], x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  x = _mm_mullo_epi32(u[11], cospi40);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  x = _mm_mullo_epi32(u[13], cospi8);
  y = _mm_mullo_epi32(u[12], cospi8);
  u[12] = _mm_mullo_epi32(u[12], cospim56);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospim56);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi40);
  y = _mm_mullo_epi32(u[14], cospi40);
  u[14] = _mm_mullo_epi32(u[14], cospim24);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim24);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 5
  addsub_sse4_1(u[0], u[4], &u[0], &u[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &u[1], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &u[2], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &u[3], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[12], &u[8], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[13], &u[9], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[10], u[14], &u[10], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[15], &u[11], &u[15], &clamp_lo, &clamp_hi);

  // stage 6
  x = _mm_mullo_epi32(u[5], cospi48);
  y = _mm_mullo_epi32(u[4], cospi48);
  u[4] = _mm_mullo_epi32(u[4], cospi16);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(u[5], cospi16);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(u[7], cospi16);
  y = _mm_mullo_epi32(u[6], cospi16);
  u[6] = _mm_mullo_epi32(u[6], cospim48);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(u[7], cospim48);
  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  x = _mm_mullo_epi32(u[13], cospi48);
  y = _mm_mullo_epi32(u[12], cospi48);
  u[12] = _mm_mullo_epi32(u[12], cospi16);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospi16);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi16);
  y = _mm_mullo_epi32(u[14], cospi16);
  u[14] = _mm_mullo_epi32(u[14], cospim48);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim48);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 7
  addsub_sse4_1(u[0], u[2], &u[0], &u[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &u[1], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &u[4], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &u[5], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[10], &u[8], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[11], &u[9], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[14], &u[12], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[13], u[15], &u[13], &u[15], &clamp_lo, &clamp_hi);

  // stage 8
  y = _mm_mullo_epi32(u[2], cospi32);
  x = _mm_mullo_epi32(u[3], cospi32);
  u[2] = _mm_add_epi32(y, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(y, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);
  y = _mm_mullo_epi32(u[6], cospi32);
  x = _mm_mullo_epi32(u[7], cospi32);
  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  y = _mm_mullo_epi32(u[10], cospi32);
  x = _mm_mullo_epi32(u[11], cospi32);
  u[10] = _mm_add_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  y = _mm_mullo_epi32(u[14], cospi32);
  x = _mm_mullo_epi32(u[15], cospi32);
  u[14] = _mm_add_epi32(y, x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(zero, u[8]);
    out[2] = u[12];
    out[3] = _mm_sub_epi32(zero, u[4]);
    out[4] = u[6];
    out[5] = _mm_sub_epi32(zero, u[14]);
    out[6] = u[10];
    out[7] = _mm_sub_epi32(zero, u[2]);
    out[8] = u[3];
    out[9] = _mm_sub_epi32(zero, u[11]);
    out[10] = u[15];
    out[11] = _mm_sub_epi32(zero, u[7]);
    out[12] = u[5];
    out[13] = _mm_sub_epi32(zero, u[13]);
    out[14] = u[9];
    out[15] = _mm_sub_epi32(zero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[12], u[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[6], u[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[10], u[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[3], u[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[15], u[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[9], u[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}